

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O0

double pidAngle(double now)

{
  Scalar *pSVar1;
  double in_XMM0_Qa;
  double dVar2;
  double dVar3;
  double result;
  double diff;
  double target;
  Vector2d vec;
  EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
  *in_stack_ffffffffffffffa8;
  Matrix<double,_2,_1,_0,_2,_1> *in_stack_ffffffffffffffb0;
  Scalar __y;
  double local_40;
  MatrixBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *in_stack_ffffffffffffffd0;
  MatrixBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *in_stack_ffffffffffffffd8;
  
  Eigen::MatrixBase<Eigen::Matrix<double,2,1,0,2,1>>::operator-
            (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  Eigen::Matrix<double,2,1,0,2,1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,2,1,0,2,1>const,Eigen::Matrix<double,2,1,0,2,1>const>>
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::x
                     ((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1> *)0x140ebb);
  __y = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::y
                     ((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1> *)0x140ecf);
  dVar2 = atan2(__y,-*pSVar1);
  local_40 = dVar2 - in_XMM0_Qa;
  if ((in_XMM0_Qa <= 2.5) || (-2.5 <= dVar2)) {
    if ((in_XMM0_Qa < -2.5) && (2.5 < dVar2)) {
      local_40 = local_40 - 6.283185307179586;
    }
  }
  else {
    local_40 = local_40 + 6.283185307179586;
  }
  dVar2 = pidAngle::accum * 0.0001;
  dVar3 = local_40 - pidAngle::old_diff;
  pidAngle::accum = local_40 + pidAngle::accum;
  pidAngle::old_diff = local_40;
  return dVar3 * 0.001 + local_40 * 0.2 + dVar2;
}

Assistant:

double pidAngle(double now) {
    Eigen::Vector2d vec = orient - obs;
    double target = atan2(vec.x(), -vec.y());
    static double old_diff = 0.0, accum = 0.0;
    double diff = target - now;
    if (now > 2.5 && target < -2.5) {
        diff += 2 * M_PI;
    } else if (now < -2.5 && target > 2.5) {
        diff -= 2 * M_PI;
    }
    double result = K_P * diff + K_I * accum + K_D * (diff - old_diff);
    accum += diff;
    old_diff = diff;
    return result;
}